

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O3

LispPTR N_OP_greaterp(LispPTR tosm1,LispPTR tos)

{
  LispPTR LVar1;
  uint uVar2;
  uint uVar3;
  
  if ((tosm1 & 0xfff0000) == 0xf0000) {
    uVar3 = tosm1 | 0xffff0000;
  }
  else if ((tosm1 & 0xfff0000) == 0xe0000) {
    uVar3 = tosm1 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(tosm1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
    goto LAB_00107be0;
    if ((tosm1 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)tosm1);
    }
    uVar3 = *(uint *)(Lisp_world + tosm1);
  }
  if ((tos & 0xfff0000) == 0xf0000) {
    uVar2 = tos | 0xffff0000;
  }
  else if ((tos & 0xfff0000) == 0xe0000) {
    uVar2 = tos & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
LAB_00107be0:
      LVar1 = N_OP_fgreaterp(tosm1,tos);
      return LVar1;
    }
    if ((tos & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)tos);
    }
    uVar2 = *(uint *)(Lisp_world + tos);
  }
  LVar1 = 0x4c;
  if ((int)uVar3 <= (int)uVar2) {
    LVar1 = 0;
  }
  return LVar1;
}

Assistant:

LispPTR N_OP_greaterp(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;

  N_GETNUMBER(tosm1, arg1, do_ufn);
  N_GETNUMBER(tos, arg2, do_ufn);

  if (arg1 > arg2)
    return (ATOM_T);
  else
    return (NIL_PTR);

do_ufn:
  return (N_OP_fgreaterp(tosm1, tos));
}